

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

bool32 rw::ps2::unfixDmaOffsets(InstanceData *inst)

{
  uint uVar1;
  uint *local_28;
  uint32 *tag;
  bool32 norefs;
  InstanceData *inst_local;
  
  tag._4_4_ = 1;
  local_28 = (uint *)inst->data;
  while( true ) {
    for (; uVar1 = *local_28 & 0x70000000, uVar1 == 0x10000000;
        local_28 = local_28 + ((*local_28 & 0xffff) + 1) * 4) {
    }
    if (uVar1 != 0x30000000) break;
    tag._4_4_ = 0;
    local_28 = local_28 + 4;
  }
  if (uVar1 != 0x60000000) {
    fprintf(_stderr,"error: unknown DMAtag %X\n",(ulong)*local_28);
  }
  return tag._4_4_;
}

Assistant:

bool32
unfixDmaOffsets(InstanceData *inst)
{
	bool32 norefs = 1;
#ifdef RW_PS2
	uint32 base = (uint32)inst->data;
#endif
	uint32 *tag = (uint32*)inst->data;
	for(;;){
		switch(tag[0]&0x70000000){
		// DMAcnt
		case 0x10000000:
			// no need to unfix
			tag += (1+(tag[0]&0xFFFF))*4;
			break;

		// DMAref
		case 0x30000000:
			norefs = 0;
			// unfix address and jump to next
#ifdef RW_PS2
			tag[1] = (tag[1] - base)>>4;
#endif
			tag += 4;
			break;

		// DMAret
		case 0x60000000:
			return norefs;

		default:
			fprintf(stderr, "error: unknown DMAtag %X\n", tag[0]);
			return norefs;
		}
	}
}